

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O2

string * gmlc::networking::addProtocol
                   (string *__return_storage_ptr__,string *networkAddress,InterfaceTypes interfaceT)

{
  size_type sVar1;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (networkAddress,"://",0);
  if (sVar1 == 0xffffffffffffffff) {
    switch(interfaceT) {
    case TCP:
    case IP:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"tcp://",&local_39);
      std::operator+(__return_storage_ptr__,&local_38,networkAddress);
      break;
    case UDP:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"udp://",&local_39);
      std::operator+(__return_storage_ptr__,&local_38,networkAddress);
      break;
    case IPC:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ipc://",&local_39);
      std::operator+(__return_storage_ptr__,&local_38,networkAddress);
      break;
    case INPROC:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"inproc://",&local_39);
      std::operator+(__return_storage_ptr__,&local_38,networkAddress);
      break;
    default:
      goto switchD_003785a6_default;
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
switchD_003785a6_default:
    std::__cxx11::string::string((string *)__return_storage_ptr__,networkAddress);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
    addProtocol(const std::string& networkAddress, InterfaceTypes interfaceT)
{
    if (networkAddress.find("://") == std::string::npos) {
        switch (interfaceT) {
            case InterfaceTypes::IP:
            case InterfaceTypes::TCP:
                return std::string("tcp://") + networkAddress;
            case InterfaceTypes::IPC:
                return std::string("ipc://") + networkAddress;
            case InterfaceTypes::UDP:
                return std::string("udp://") + networkAddress;
            case InterfaceTypes::INPROC:
                return std::string("inproc://") + networkAddress;
        }
    }
    return networkAddress;
}